

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

void __thiscall
soul::AST::TypeMetaFunction::throwErrorIfUnresolved(TypeMetaFunction *this,Type *sourceType)

{
  Expression *pEVar1;
  bool bVar2;
  CompileMessage local_f0;
  CompileMessage local_b8;
  CompileMessage local_80;
  CompileMessage local_48;
  
  bVar2 = checkSourceType(this,sourceType);
  if (!bVar2) {
    switch(this->operation) {
    case makeConst:
      Errors::tooManyConsts<>();
      Context::throwError(&(this->super_Expression).super_Statement.super_ASTObject.context,
                          &local_80,false);
    case elementType:
      Errors::badTypeForElementType<>();
      Context::throwError(&(this->super_Expression).super_Statement.super_ASTObject.context,
                          &local_b8,false);
    case primitiveType:
      Errors::badTypeForPrimitiveType<>();
      Context::throwError(&(this->super_Expression).super_Statement.super_ASTObject.context,
                          &local_f0,false);
    case size:
      pEVar1 = (this->source).object;
      Errors::cannotTakeSizeOfType<>();
      Context::throwError(&(pEVar1->super_Statement).super_ASTObject.context,&local_48,false);
    }
  }
  return;
}

Assistant:

void throwErrorIfUnresolved (const Type& sourceType) const
        {
            if (! checkSourceType (sourceType))
            {
                if (operation == Op::size)           source->context.throwError (Errors::cannotTakeSizeOfType());
                if (operation == Op::makeConst)      context.throwError (Errors::tooManyConsts());
                if (operation == Op::elementType)    context.throwError (Errors::badTypeForElementType());
                if (operation == Op::primitiveType)  context.throwError (Errors::badTypeForPrimitiveType());
            }
        }